

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void RecursiveTreeCompose
               (IceTInt *compose_group,IceTInt group_size,IceTInt group_rank,IceTInt image_dest,
               IceTSparseImage *imageData,IceTVoid *inSparseImageBuffer,IceTSparseImage *imageBuffer
               )

{
  IceTVoid *pIVar1;
  IceTEnum color_format;
  IceTEnum depth_format;
  IceTSizeType IVar2;
  IceTSizeType height;
  IceTSparseImage front_buffer;
  uint uVar3;
  IceTSparseImage back_buffer;
  uint group_size_00;
  IceTSizeType package_size;
  IceTVoid *package_buffer;
  
  if (group_size < 2) {
    return;
  }
  group_size_00 = (uint)group_size >> 1;
  if (group_rank < (int)group_size_00) {
    RecursiveTreeCompose
              (compose_group,group_size_00,group_rank,image_dest,imageData,inSparseImageBuffer,
               imageBuffer);
    uVar3 = group_size_00;
    if (group_rank != image_dest) {
      if ((uint)image_dest < group_size_00 || group_rank != 0) {
        return;
      }
      if ((int)group_size_00 <= image_dest && image_dest < group_size) goto LAB_00116fa7;
    }
  }
  else {
    RecursiveTreeCompose
              (compose_group + group_size_00,group_size - group_size_00,group_rank - group_size_00,
               image_dest - group_size_00,imageData,inSparseImageBuffer,imageBuffer);
    uVar3 = 0;
    if (group_rank != image_dest) {
      if (group_rank != group_size_00) {
        return;
      }
      if (group_rank <= image_dest && image_dest < group_size) {
        return;
      }
      if ((uint)group_rank <= (uint)image_dest) {
        image_dest = 0;
      }
LAB_00116fa7:
      icetSparseImagePackageForSend
                ((IceTSparseImage)imageData->opaque_internals,&package_buffer,&package_size);
      icetCommSend(package_buffer,package_size,0x8001,compose_group[(uint)image_dest],0x17);
      return;
    }
  }
  color_format = icetSparseImageGetColorFormat((IceTSparseImage)imageData->opaque_internals);
  depth_format = icetSparseImageGetDepthFormat((IceTSparseImage)imageData->opaque_internals);
  IVar2 = icetSparseImageGetWidth((IceTSparseImage)imageData->opaque_internals);
  height = icetSparseImageGetHeight((IceTSparseImage)imageData->opaque_internals);
  IVar2 = icetSparseImageBufferSizeType(color_format,depth_format,IVar2,height);
  icetCommRecv(inSparseImageBuffer,IVar2,0x8001,compose_group[uVar3],0x17);
  front_buffer = icetSparseImageUnpackageFromReceive(inSparseImageBuffer);
  back_buffer.opaque_internals = imageData->opaque_internals;
  if (group_rank < (int)uVar3) {
    back_buffer = front_buffer;
    front_buffer.opaque_internals = imageData->opaque_internals;
  }
  icetCompressedCompressedComposite
            (front_buffer,back_buffer,(IceTSparseImage)imageBuffer->opaque_internals);
  pIVar1 = imageData->opaque_internals;
  imageData->opaque_internals = imageBuffer->opaque_internals;
  imageBuffer->opaque_internals = pIVar1;
  return;
}

Assistant:

static void RecursiveTreeCompose(const IceTInt *compose_group,
                                 IceTInt group_size,
                                 IceTInt group_rank,
                                 IceTInt image_dest,
                                 IceTSparseImage *imageData,
                                 IceTVoid *inSparseImageBuffer,
                                 IceTSparseImage *imageBuffer)
{
    IceTInt middle;
    enum { NO_IMAGE, SEND_IMAGE, RECV_IMAGE } current_image;
    IceTInt pair_proc;

    if (group_size <= 1) return;

  /* Build composite tree by splitting down middle. */
  /* If middle is in a group, then the image is sent there, otherwise the
   * image is sent to the processor of group_rank 0 (for that subgroup). */
    middle = group_size/2;
    if (group_rank < middle) {
        RecursiveTreeCompose(compose_group, middle, group_rank, image_dest,
                             imageData, inSparseImageBuffer, imageBuffer);
        if (group_rank == image_dest) {
          /* I'm the destination.  GIMME! */
            current_image = RECV_IMAGE;
            pair_proc = middle;
        } else if (   (group_rank == 0)
                   && ((image_dest < 0) || (image_dest >= middle)) ) {
          /* I have an image by default. */
            if ((image_dest >= middle) && (image_dest < group_size)) {
              /* Opposite subtree has destination.  Hand it over. */
                current_image = SEND_IMAGE;
                pair_proc = image_dest;
            } else {
              /* Opposite subtree does not have destination either.  Give
                 to me by default. */
                current_image = RECV_IMAGE;
                pair_proc = middle;
            }
        } else {
          /* I don't even have an image anymore. */
            current_image = NO_IMAGE;
            pair_proc = -1;
        }
    } else {
        RecursiveTreeCompose(compose_group + middle, group_size - middle,
                             group_rank - middle, image_dest - middle,
                             imageData, inSparseImageBuffer, imageBuffer);
        if (group_rank == image_dest) {
          /* I'm the destination.  GIMME! */
            current_image = RECV_IMAGE;
            pair_proc = 0;
        } else if (   (group_rank == middle)
                   && ((image_dest < middle) || (image_dest >= group_size)) ) {
          /* I have an image by default. */
            current_image = SEND_IMAGE;
            if ((image_dest >= 0) && (image_dest < middle)) {
                pair_proc = image_dest;
            } else {
                pair_proc = 0;
            }
        } else {
          /* I don't even have an image anymore. */
            current_image = NO_IMAGE;
            pair_proc = -1;
        }
    }

    if (current_image == SEND_IMAGE) {
      /* Hasta la vista, baby. */
        IceTVoid *package_buffer;
        IceTSizeType package_size;
        icetRaiseDebug1("Sending image to %d", (int)compose_group[pair_proc]);
        icetSparseImagePackageForSend(*imageData,
                                      &package_buffer,
                                      &package_size);
        icetCommSend(package_buffer, package_size, ICET_BYTE,
                     compose_group[pair_proc], TREE_IMAGE_DATA);
    } else if (current_image == RECV_IMAGE) {
      /* Get my image. */
        IceTSparseImage inSparseImage;
        IceTSizeType incoming_size;
        icetRaiseDebug1("Getting image from %d", (int)compose_group[pair_proc]);
        incoming_size = icetSparseImageBufferSizeType(
                                      icetSparseImageGetColorFormat(*imageData),
                                      icetSparseImageGetDepthFormat(*imageData),
                                      icetSparseImageGetWidth(*imageData),
                                      icetSparseImageGetHeight(*imageData));
        icetCommRecv(inSparseImageBuffer, incoming_size, ICET_BYTE,
                     compose_group[pair_proc], TREE_IMAGE_DATA);
        inSparseImage
            = icetSparseImageUnpackageFromReceive(inSparseImageBuffer);
        if (group_rank < pair_proc) {
            icetCompressedCompressedComposite(*imageData,
                                              inSparseImage,
                                              *imageBuffer);
        } else {
            icetCompressedCompressedComposite(inSparseImage,
                                              *imageData,
                                              *imageBuffer);
        }
        /* The actual image data is now in imageBuffer, so switch imageBuffer
           and imageData. */
        {
            IceTSparseImage oldImage = *imageData;
            *imageData = *imageBuffer;
            *imageBuffer = oldImage;
        }
    }
}